

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testUleb(void)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 uVar3;
  char *p;
  uint64_t x;
  size_t i;
  char buffer [16];
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *this;
  C *in_stack_ffffffffffffff98;
  undefined1 local_50 [32];
  char *local_30;
  ulong local_28;
  ulong local_20;
  
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    local_28 = testUleb::values[local_20];
    this = (StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&stack0xffffffffffffffe8;
    local_30 = axl::enc::encodeUleb128<unsigned_long>((char *)this,local_28);
    uVar2 = local_28;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_28;
    uVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(10000000)) / auVar1,0);
    axl::enc::HexEncoding::encode(in_stack_ffffffffffffff98,(size_t)local_50,0);
    in_stack_ffffffffffffff98 =
         axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz(this);
    printf("0x%llx (%d us, %d bps) -> %s\n",uVar2,uVar2,uVar3,in_stack_ffffffffffffff98);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11cdeb);
  }
  return;
}

Assistant:

void testUleb() {
	static uint64_t values[] = {
		0x13AF12,
		0x00270F,
	};

	char buffer[16];

	for (size_t i = 0; i < countof(values); i++) {
		uint64_t x = values[i];
		char* p = enc::encodeUleb128(buffer, x);
		printf("0x%llx (%d us, %d bps) -> %s\n", x, x, 1000000ULL * 10 / x, enc::HexEncoding::encode(buffer, p - buffer).sz());
	}
}